

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ImportModuleFunctions(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  ModuleData **ppMVar1;
  SmallArray<FunctionData_*,_128U> *this;
  uchar uVar2;
  uchar uVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  ByteCode *code;
  FunctionData *pFVar7;
  NamespaceData **ppNVar8;
  ModuleData *pMVar9;
  Allocator *pAVar10;
  Lexeme *pLVar11;
  ArgumentData *pAVar12;
  char *pcVar13;
  IntrusiveList<MatchData> generics_00;
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint offset;
  int iVar18;
  char *pcVar19;
  ExternFuncInfo *pEVar20;
  ExternLocalInfo *pEVar21;
  size_t sVar22;
  TypeFunction *pTVar23;
  undefined4 extraout_var;
  TypeBase *pTVar25;
  MatchData *node;
  TypeRef *pTVar26;
  SynBase *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FunctionData *pFVar27;
  TypeBase *pTVar28;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TypeHandle *pTVar29;
  TypeBase *pTVar30;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined8 *puVar31;
  byte bVar32;
  ModuleData **ppMVar33;
  Node *pNVar34;
  TypeFunction *type;
  char *pcVar35;
  uint *puVar36;
  ulong uVar37;
  NamespaceData *nameSpace;
  ulong uVar38;
  TypeHandle *pTVar39;
  ExternFuncInfo *pEVar40;
  FunctionData *pFVar41;
  long lVar42;
  ScopeData *pSVar43;
  ulong uVar44;
  bool bVar45;
  NodeIterator NVar46;
  IntrusiveList<TypeHandle> arguments;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  FunctionLookupChain chain;
  ExternVarInfo *local_e8;
  InplaceStr functionName;
  IntrusiveList<MatchData> generics;
  FunctionLookupChain local_78;
  InplaceStr local_60;
  InplaceStr defaultAssignName;
  TraceScope traceScope;
  SynIdentifier *pSVar24;
  ExprBase *context;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  undefined4 extraout_var_11;
  undefined4 extraout_var_14;
  
  if ((ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar15 = __cxa_guard_acquire(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)
                                    ::token), iVar15 != 0)) {
    ImportModuleFunctions::token = NULLC::TraceGetToken("analyze","ImportModuleFunctions");
    __cxa_guard_release(&ImportModuleFunctions(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleFunctions::token);
  code = moduleCtx->data->bytecode;
  pcVar19 = FindSymbols(code);
  local_e8 = FindFirstVar(code);
  ppMVar1 = &moduleCtx->data;
  uVar16 = code->variableCount;
  (*ppMVar1)->importedFunctionCount = code->moduleFunctionCount;
  pEVar20 = FindFirstFunc(code);
  pEVar21 = FindFirstLocal(code);
  uVar6 = (ctx->functions).count;
  defaultAssignName.begin = "default_assign$_";
  defaultAssignName.end = "";
  if (code->functionCount != code->moduleFunctionCount) {
    local_e8 = local_e8 + uVar16;
    this = &ctx->functions;
    uVar38 = 0;
    do {
      pcVar35 = pcVar19 + pEVar20[uVar38].offsetToName;
      functionName.begin = pcVar35;
      sVar22 = strlen(pcVar35);
      functionName.end = pcVar35 + sVar22;
      pTVar23 = (TypeFunction *)
                GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar20[uVar38].funcType);
      pEVar40 = pEVar20 + uVar38;
      if (pTVar23 == (TypeFunction *)0x0) {
        anon_unknown.dwarf_9c70f::Stop
                  (ctx,source,"ERROR: can\'t find function \'%s\' type in module %.*s",
                   pcVar19 + pEVar40->offsetToName,
                   (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)((*ppMVar1)->name).begin));
      }
      generics.head = (MatchData *)0x0;
      generics.tail = (MatchData *)0x0;
      if (pEVar40->explicitTypeCount == 0) {
        bVar32 = 0;
        uVar37 = 0;
      }
      else {
        puVar36 = &local_e8->type;
        uVar44 = 0;
        bVar32 = 0;
        do {
          pcVar35 = pcVar19 + ((ExternVarInfo *)(puVar36 + -2))->offsetToName;
          sVar22 = strlen(pcVar35);
          iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar24 = (SynIdentifier *)CONCAT44(extraout_var,iVar15);
          (pSVar24->super_SynBase).typeID = 4;
          (pSVar24->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar24->super_SynBase).end = (Lexeme *)0x0;
          (pSVar24->super_SynBase).pos.begin = (char *)0x0;
          (pSVar24->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar24->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar24->super_SynBase).next + 2) = 0;
          (pSVar24->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
          (pSVar24->name).begin = pcVar35;
          (pSVar24->name).end = pcVar35 + sVar22;
          if (*puVar36 == 0xffffffff) {
            pTVar25 = ctx->typeGeneric;
          }
          else {
            pTVar25 = GetImportedModuleTypeAt(ctx,source,moduleCtx,*puVar36);
          }
          if (pTVar25 == (TypeBase *)0x0) {
            pcVar35 = ((*ppMVar1)->name).begin;
            anon_unknown.dwarf_9c70f::Stop
                      (ctx,source,
                       "ERROR: can\'t find function \'%s\' explicit type \'%d\' in module %.*s",
                       pcVar19 + pEVar40->offsetToName,uVar44 & 0xffffffff,
                       (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)pcVar35),pcVar35);
          }
          bVar45 = pTVar25->isGeneric;
          iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          node = (MatchData *)CONCAT44(extraout_var_00,iVar15);
          bVar32 = bVar32 | bVar45;
          node->name = pSVar24;
          node->type = pTVar25;
          node->next = (MatchData *)0x0;
          node->listed = false;
          IntrusiveList<MatchData>::push_back(&generics,node);
          uVar44 = uVar44 + 1;
          uVar37 = (ulong)pEVar40->explicitTypeCount;
          puVar36 = puVar36 + 4;
        } while (uVar44 < uVar37);
      }
      local_e8 = local_e8 + uVar37;
      uVar16 = pEVar40->nameHash;
      pSVar43 = (ScopeData *)&ctx->scope;
      do {
        pSVar43 = pSVar43->scope;
        if (pSVar43 == (ScopeData *)0x0) goto LAB_001719b8;
        NVar46 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar43->idLookupMap,uVar16);
        pNVar34 = NVar46.node;
      } while (pNVar34 == (Node *)0x0);
      if (*(long *)(pNVar34 + 0x10) == 0) {
LAB_001719b8:
        pFVar41 = (FunctionData *)0x0;
      }
      else {
        pFVar27 = (FunctionData *)0x0;
        chain.node = NVar46;
        chain.scope = pSVar43;
        do {
          pFVar7 = *(FunctionData **)(pNVar34 + 0x10);
          pFVar41 = pFVar7;
          if ((pFVar7->isPrototype == false) && (pFVar41 = pFVar27, pFVar7->type == pTVar23)) {
            if (pEVar40->explicitTypeCount == 0) {
              pcVar35 = (pFVar7->name->name).begin;
              if ((*pcVar35 != '$') && (pFVar7->isGenericInstance != true)) {
                pcVar19 = (pFVar7->type->super_TypeBase).name.begin;
                pcVar13 = ((*ppMVar1)->name).begin;
                anon_unknown.dwarf_9c70f::Stop
                          (ctx,source,
                           "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s"
                           ,(ulong)(uint)(*(int *)&(pFVar7->name->name).end - (int)pcVar35),pcVar35,
                           (ulong)(uint)(*(int *)&(pFVar7->type->super_TypeBase).name.end -
                                        (int)pcVar19),pcVar19,
                           *(int *)&((*ppMVar1)->name).end - (int)pcVar13,pcVar13);
              }
              uVar16 = (ctx->functions).count;
              if (uVar16 == (ctx->functions).max) {
                SmallArray<FunctionData_*,_128U>::grow(this,uVar16);
              }
              if (this->data == (FunctionData **)0x0) {
                pcVar19 = 
                "void SmallArray<FunctionData *, 128>::push_back(const T &) [T = FunctionData *, N = 128]"
                ;
                goto LAB_0017273a;
              }
              uVar16 = (ctx->functions).count;
              (ctx->functions).count = uVar16 + 1;
              this->data[uVar16] = pFVar7;
              goto LAB_00172497;
            }
            uVar16 = 0;
            do {
              IntrusiveList<MatchData>::operator[]
                        ((IntrusiveList<MatchData> *)(*(long *)(pNVar34 + 0x10) + 0x48),uVar16);
              IntrusiveList<MatchData>::operator[](&generics,uVar16);
              uVar16 = uVar16 + 1;
            } while (uVar16 < pEVar40->explicitTypeCount);
          }
          anon_unknown.dwarf_9c70f::FunctionLookupChain::next(&local_78,&chain);
          chain.scope = local_78.scope;
          chain.node.node = local_78.node.node;
          chain.node.start = local_78.node.start;
          pNVar34 = local_78.node.node;
          pFVar27 = pFVar41;
        } while (local_78.node.node != (Node *)0x0);
      }
      uVar37 = (ulong)(ctx->namespaces).count;
      if (uVar37 == 0) {
LAB_00171a13:
        bVar45 = false;
      }
      else {
        ppNVar8 = (ctx->namespaces).data;
        nameSpace = *ppNVar8;
        bVar45 = true;
        if (nameSpace->fullNameHash != pEVar40->namespaceHash) {
          uVar44 = 0;
          do {
            if (uVar37 - 1 == uVar44) goto LAB_00171a13;
            nameSpace = ppNVar8[uVar44 + 1];
            uVar44 = uVar44 + 1;
          } while (nameSpace->fullNameHash != pEVar40->namespaceHash);
          bVar45 = uVar44 < uVar37;
        }
        ExpressionContext::PushScope(ctx,nameSpace);
      }
      if (pEVar40->parentType == 0xffffffff) {
        pTVar25 = (TypeBase *)0x0;
      }
      else {
        pTVar25 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar40->parentType);
        if (pTVar25 == (TypeBase *)0x0) {
          anon_unknown.dwarf_9c70f::Stop
                    (ctx,source,"ERROR: can\'t find function \'%s\' parent type in module %.*s",
                     pcVar19 + pEVar40->offsetToName,
                     (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)((*ppMVar1)->name).begin))
          ;
        }
      }
      if (pEVar40->contextType == 0xffffffff) {
        pTVar28 = pTVar25;
        if (pTVar25 == (TypeBase *)0x0) {
          pTVar28 = ctx->typeVoid;
        }
        pTVar26 = ExpressionContext::GetReferenceType(ctx,pTVar28);
      }
      else {
        pTVar26 = (TypeRef *)GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar40->contextType);
        if (pTVar26 == (TypeRef *)0x0) {
          anon_unknown.dwarf_9c70f::Stop
                    (ctx,source,"ERROR: can\'t find function \'%s\' context type in module %.*s",
                     pcVar19 + pEVar40->offsetToName,
                     (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)((*ppMVar1)->name).begin))
          ;
        }
      }
      uVar2 = pEVar40->funcCat;
      uVar3 = pEVar40->isOperator;
      cVar4 = functionName.end[-1];
      if (pTVar25 != (TypeBase *)0x0) {
        ExpressionContext::PushScope(ctx,pTVar25);
      }
      ppMVar33 = ppMVar1;
      if (pEVar40->definitionModule != 0) {
        uVar16 = pEVar40->definitionModule - 1;
        if ((moduleCtx->dependencies).count <= uVar16) {
          pcVar19 = 
          "T &SmallArray<ModuleData *, 32>::operator[](unsigned int) [T = ModuleData *, N = 32]";
          goto LAB_00172770;
        }
        ppMVar33 = (moduleCtx->dependencies).data + uVar16;
      }
      pMVar9 = *ppMVar33;
      uVar16 = pMVar9->lexStreamSize;
      if (uVar16 <= pEVar40->definitionLocationStart) {
        __assert_fail("function.definitionLocationStart < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32fe,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (uVar16 <= pEVar40->definitionLocationEnd) {
        __assert_fail("function.definitionLocationEnd < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x32ff,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      this_00 = source;
      if (pEVar40->definitionLocationEnd != 0 || pEVar40->definitionLocationStart != 0) {
        iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar15);
        SynBase::SynBase(this_00,1,pMVar9->lexStream + pEVar40->definitionLocationStart,
                         pMVar9->lexStream + pEVar40->definitionLocationEnd);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_00224430;
        uVar16 = pMVar9->lexStreamSize;
      }
      uVar17 = pEVar40->definitionLocationName;
      if (uVar16 <= uVar17) {
        __assert_fail("function.definitionLocationName < importModule->lexStreamSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x3303,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      pAVar10 = ctx->allocator;
      if ((ulong)uVar17 == 0) {
        iVar15 = (*pAVar10->_vptr_Allocator[2])(pAVar10,0x50);
        pSVar24 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar15);
        (pSVar24->super_SynBase).typeID = 4;
        (pSVar24->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar24->super_SynBase).end = (Lexeme *)0x0;
        (pSVar24->super_SynBase).pos.begin = (char *)0x0;
        (pSVar24->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).next + 2) = 0;
        local_148 = functionName.begin._0_4_;
        uStack_144 = functionName.begin._4_4_;
        uStack_140 = functionName.end._0_4_;
        uStack_13c = functionName.end._4_4_;
      }
      else {
        pLVar11 = pMVar9->lexStream;
        iVar15 = (*pAVar10->_vptr_Allocator[2])(pAVar10,0x50);
        pcVar13 = functionName.end;
        pcVar35 = functionName.begin;
        pSVar24 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar15);
        SynBase::SynBase((SynBase *)pSVar24,4,pLVar11 + uVar17,pLVar11 + uVar17);
        local_148 = SUB84(pcVar35,0);
        uStack_144 = (undefined4)((ulong)pcVar35 >> 0x20);
        uStack_140 = SUB84(pcVar13,0);
        uStack_13c = (undefined4)((ulong)pcVar13 >> 0x20);
      }
      (pSVar24->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      *(undefined4 *)&(pSVar24->name).begin = local_148;
      *(undefined4 *)((long)&(pSVar24->name).begin + 4) = uStack_144;
      *(undefined4 *)&(pSVar24->name).end = uStack_140;
      *(undefined4 *)((long)&(pSVar24->name).end + 4) = uStack_13c;
      iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
      pFVar27 = (FunctionData *)CONCAT44(extraout_var_04,iVar15);
      type = pTVar23;
      if ((pTVar23->super_TypeBase).typeID != 0x15) {
        type = (TypeFunction *)0x0;
      }
      uVar16 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar16 + 1;
      generics_00.tail._0_4_ = (int)generics.tail;
      generics_00.head = generics.head;
      generics_00.tail._4_4_ = (int)((ulong)generics.tail >> 0x20);
      FunctionData::FunctionData
                (pFVar27,ctx->allocator,this_00,ctx->scope,uVar2 == '\x03',cVar4 == '$',
                 uVar3 != '\0',type,&pTVar26->super_TypeBase,pSVar24,generics_00,uVar16);
      pFVar27->importModule = pMVar9;
      pFVar27->isPrototype = SUB41((uint)pEVar40->regVmCodeSize >> 0x1f,0);
      if (pFVar41 != (FunctionData *)0x0) {
        pFVar41->implementation = pFVar27;
      }
      pFVar27->isGenericInstance = pEVar40->isGenericInstance != '\0';
      chain.node.node = (Node *)0x1da56d;
      chain.node.start = (Node *)"__newS";
      bVar14 = InplaceStr::operator==(&pFVar27->name->name,(InplaceStr *)&chain);
      if (bVar14) {
LAB_00171d8f:
        pFVar27->isInternal = true;
      }
      else {
        local_78.node.start = (Node *)0x1da56e;
        local_78.node.node = (Node *)0x1da574;
        bVar14 = InplaceStr::operator==(&pFVar27->name->name,(InplaceStr *)&local_78);
        if (bVar14) goto LAB_00171d8f;
        local_60.begin = "__closeUpvalue";
        local_60.end = "";
        bVar14 = InplaceStr::operator==(&pFVar27->name->name,&local_60);
        if (bVar14) goto LAB_00171d8f;
      }
      if (pEVar40->funcCat == '\x01') {
        pFVar27->isHidden = true;
      }
      pFVar27->attributes = pEVar40->attributes;
      ExpressionContext::AddFunction(ctx,pFVar27);
      ExpressionContext::PushScope(ctx,pFVar27);
      pFVar27->functionScope = ctx->scope;
      if (pEVar40->paramCount != 0) {
        uVar16 = 0;
        do {
          uVar17 = pEVar40->offsetToFirstLocal + uVar16;
          bVar5 = pEVar21[uVar17].paramFlags;
          if (pEVar21[uVar17].type == 0xffffffff) {
            pTVar28 = ctx->typeGeneric;
          }
          else {
            pTVar28 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar21[uVar17].type);
          }
          if (pTVar28 == (TypeBase *)0x0) {
            pcVar35 = ((*ppMVar1)->name).begin;
            anon_unknown.dwarf_9c70f::Stop
                      (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                       (ulong)(uVar16 + 1),pcVar19 + pEVar40->offsetToName,
                       (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)pcVar35),pcVar35);
          }
          pcVar35 = pcVar19 + pEVar21[uVar17].offsetToName;
          sVar22 = strlen(pcVar35);
          iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar24 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar15);
          (pSVar24->super_SynBase).typeID = 4;
          (pSVar24->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar24->super_SynBase).end = (Lexeme *)0x0;
          (pSVar24->super_SynBase).pos.begin = (char *)0x0;
          (pSVar24->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar24->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar24->super_SynBase).next + 2) = 0;
          (pSVar24->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
          (pSVar24->name).begin = pcVar35;
          (pSVar24->name).end = pcVar35 + sVar22;
          uVar17 = (pFVar27->arguments).count;
          if (uVar17 == (pFVar27->arguments).max) {
            SmallArray<ArgumentData,_4U>::grow(&pFVar27->arguments,uVar17);
          }
          pAVar12 = (pFVar27->arguments).data;
          if (pAVar12 == (ArgumentData *)0x0) {
            pcVar19 = 
            "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]";
            goto LAB_0017273a;
          }
          uVar17 = (pFVar27->arguments).count;
          (pFVar27->arguments).count = uVar17 + 1;
          pAVar12[uVar17].source = source;
          pAVar12[uVar17].isExplicit = (bool)(bVar5 & 1);
          pAVar12[uVar17].name = pSVar24;
          pAVar12[uVar17].type = pTVar28;
          pAVar12[uVar17].value = (ExprBase *)0x0;
          (&pAVar12[uVar17].value)[1] = (ExprBase *)0x0;
          offset = anon_unknown.dwarf_9c70f::AllocateArgumentInScope(ctx,source,0,pTVar28);
          iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          uVar17 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar17 + 1;
          VariableData::VariableData
                    ((VariableData *)CONCAT44(extraout_var_06,iVar15),ctx->allocator,source,
                     ctx->scope,0,pTVar28,pSVar24,offset,uVar17);
          ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_06,iVar15),true);
          uVar16 = uVar16 + 1;
        } while (uVar16 < pEVar40->paramCount);
      }
      if (pTVar26 == (TypeRef *)0x0) {
        __assert_fail("contextType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x333c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      if (pTVar25 == (TypeBase *)0x0) {
        uVar17 = anon_unknown.dwarf_9c70f::AllocateArgumentInScope
                           (ctx,source,0,&pTVar26->super_TypeBase);
        iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar24 = (SynIdentifier *)CONCAT44(extraout_var_09,iVar15);
        (pSVar24->super_SynBase).typeID = 4;
        (pSVar24->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar24->super_SynBase).end = (Lexeme *)0x0;
        (pSVar24->super_SynBase).pos.begin = (char *)0x0;
        (pSVar24->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).next + 2) = 0;
        (pSVar24->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
        (pSVar24->name).begin = "$context";
        (pSVar24->name).end = "";
        iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        uVar16 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar16 + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_10,iVar15),ctx->allocator,source,ctx->scope
                   ,0,&pTVar26->super_TypeBase,pSVar24,uVar17,uVar16);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_10,iVar15),false);
      }
      else {
        pTVar26 = ExpressionContext::GetReferenceType(ctx,pTVar25);
        uVar17 = anon_unknown.dwarf_9c70f::AllocateArgumentInScope
                           (ctx,source,0,&pTVar26->super_TypeBase);
        iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar24 = (SynIdentifier *)CONCAT44(extraout_var_07,iVar15);
        (pSVar24->super_SynBase).typeID = 4;
        (pSVar24->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar24->super_SynBase).end = (Lexeme *)0x0;
        (pSVar24->super_SynBase).pos.begin = (char *)0x0;
        (pSVar24->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar24->super_SynBase).next + 2) = 0;
        (pSVar24->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
        (pSVar24->name).begin = "this";
        (pSVar24->name).end = "";
        iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        uVar16 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar16 + 1;
        VariableData::VariableData
                  ((VariableData *)CONCAT44(extraout_var_08,iVar15),ctx->allocator,source,ctx->scope
                   ,0,&pTVar26->super_TypeBase,pSVar24,uVar17,uVar16);
        ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_08,iVar15),true);
        if ((pTVar25->typeID == 0x18) &&
           (pcVar35 = strstr((pFVar27->name->name).begin,"::"), pcVar35 != (char *)0x0)) {
          uVar16 = *(uint *)&pTVar25[3].name.end;
          if (uVar16 == *(uint *)((long)&pTVar25[3].name.end + 4)) {
            SmallArray<FunctionData_*,_4U>::grow
                      ((SmallArray<FunctionData_*,_4U> *)&pTVar25[3].name,uVar16);
          }
          pcVar13 = pTVar25[3].name.begin;
          if (pcVar13 == (char *)0x0) {
            pcVar19 = 
            "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]";
LAB_0017273a:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,pcVar19);
          }
          uVar16 = *(uint *)&pTVar25[3].name.end;
          *(uint *)&pTVar25[3].name.end = uVar16 + 1;
          *(FunctionData **)(pcVar13 + (ulong)uVar16 * 8) = pFVar27;
          sVar22 = strlen(pcVar35 + 2);
          uVar16 = NULLC::GetStringHash(pcVar35 + 2,pcVar35 + sVar22 + 2);
          DirectChainedMap<FunctionData_*>::insert
                    ((DirectChainedMap<FunctionData_*> *)&pTVar25[3].arrayTypes,uVar16,pFVar27);
        }
      }
      pFVar27->argumentsSize = pFVar27->functionScope->dataSize;
      if (((pEVar40->funcType == 0) || (((bVar32 | (pTVar23->super_TypeBase).isGeneric) & 1) != 0))
         || ((pTVar25 != (TypeBase *)0x0 && (pTVar25->isGeneric == true)))) {
        if (pFVar27->importModule->lexStreamSize <= pEVar40->genericOffsetStart) {
          __assert_fail("function.genericOffsetStart < data->importModule->lexStreamSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x3364,
                        "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)"
                       );
        }
        pFVar27->delayedDefinition = pFVar27->importModule->lexStream + pEVar40->genericOffsetStart;
        if (pEVar40->genericReturnType == 0xffffffff) {
          pTVar28 = ctx->typeAuto;
        }
        else {
          pTVar28 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar40->genericReturnType);
        }
        if (pTVar28 == (TypeBase *)0x0) {
          anon_unknown.dwarf_9c70f::Stop
                    (ctx,source,
                     "ERROR: can\'t find generic function \'%s\' return type in module %.*s",
                     pcVar19 + pEVar40->offsetToName,
                     (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)((*ppMVar1)->name).begin))
          ;
        }
        chain.node = (Node)ZEXT816(0);
        if (pEVar40->paramCount == 0) {
          pTVar39 = (TypeHandle *)0x0;
          pTVar29 = (TypeHandle *)0x0;
        }
        else {
          uVar16 = 0;
          do {
            uVar17 = pEVar40->offsetToFirstLocal;
            iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
            pTVar29 = (TypeHandle *)CONCAT44(extraout_var_11,iVar15);
            if (pEVar21[uVar17 + uVar16].type == 0xffffffff) {
              pTVar30 = ctx->typeGeneric;
            }
            else {
              pTVar30 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar21[uVar17 + uVar16].type);
            }
            pTVar29->type = pTVar30;
            pTVar29->next = (TypeHandle *)0x0;
            pTVar29->listed = false;
            IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&chain,pTVar29);
            uVar16 = uVar16 + 1;
          } while (uVar16 < pEVar40->paramCount);
          pTVar29 = (TypeHandle *)chain.node.start;
          pTVar39 = (TypeHandle *)chain.node.node;
        }
        arguments.tail = pTVar39;
        arguments.head = pTVar29;
        pTVar23 = ExpressionContext::GetFunctionType(ctx,source,pTVar28,arguments);
        pFVar27->type = pTVar23;
      }
      if (pFVar27->type == (TypeFunction *)0x0) {
        __assert_fail("data->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x337c,
                      "void ImportModuleFunctions(ExpressionContext &, SynBase *, ModuleContext &)")
        ;
      }
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
      if ((pFVar27->isPrototype != false) || (pFVar27->isHidden == true)) {
        ExpressionContext::HideFunction(ctx,pFVar27);
      }
      if (pTVar25 != (TypeBase *)0x0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
      }
      if (bVar45) {
        ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE,true);
      }
      bVar45 = InplaceStr::operator==(&functionName,&defaultAssignName);
      if ((((bVar45) && ((pFVar27->arguments).count == 2)) &&
          (pTVar25 = (pFVar27->arguments).data[1].type, pTVar25 != (TypeBase *)0x0)) &&
         (pTVar25->typeID == 0x18)) {
        *(FunctionData **)&pTVar25[3].typeID = pFVar27;
      }
LAB_00172497:
      uVar38 = uVar38 + 1;
      uVar16 = code->functionCount;
      uVar17 = code->moduleFunctionCount;
    } while (uVar38 < uVar16 - uVar17);
    if (uVar16 != uVar17) {
      uVar38 = 0;
      do {
        uVar37 = uVar38 + uVar6;
        if ((ctx->functions).count <= uVar37) {
LAB_0017275b:
          pcVar19 = 
          "T &SmallArray<FunctionData *, 128>::operator[](unsigned int) [T = FunctionData *, N = 128]"
          ;
LAB_00172770:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,pcVar19);
        }
        uVar44 = (ulong)pEVar20[uVar38].paramCount;
        if (pEVar20[uVar38].paramCount != 0) {
          pFVar41 = this->data[uVar37];
          lVar42 = 0x20;
          uVar37 = 0;
          do {
            if (pEVar21[pEVar20[uVar38].offsetToFirstLocal + (int)uVar37].defaultFuncId != 0xffff) {
              uVar16 = (pEVar21[pEVar20[uVar38].offsetToFirstLocal + (int)uVar37].defaultFuncId +
                       uVar6) - code->moduleFunctionCount;
              if ((ctx->functions).count <= uVar16) goto LAB_0017275b;
              pFVar27 = (ctx->functions).data[uVar16];
              iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pTVar23 = pFVar27->type;
              iVar18 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
              context = (ExprBase *)CONCAT44(extraout_var_13,iVar18);
              pTVar25 = pFVar27->contextType;
              context->typeID = 9;
              context->source = source;
              context->type = pTVar25;
              context->next = (ExprBase *)0x0;
              context->listed = false;
              context->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235f0;
              ExprFunctionAccess::ExprFunctionAccess
                        ((ExprFunctionAccess *)CONCAT44(extraout_var_12,iVar15),source,
                         &pTVar23->super_TypeBase,pFVar27,context);
              iVar18 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
              puVar31 = (undefined8 *)CONCAT44(extraout_var_14,iVar18);
              pTVar25 = pFVar27->type->returnType;
              *(undefined4 *)(puVar31 + 1) = 0x29;
              puVar31[2] = source;
              puVar31[3] = pTVar25;
              puVar31[4] = 0;
              *(undefined1 *)(puVar31 + 5) = 0;
              *puVar31 = &PTR__ExprBase_00223f28;
              puVar31[6] = (ExprFunctionAccess *)CONCAT44(extraout_var_12,iVar15);
              puVar31[7] = 0;
              puVar31[8] = 0;
              if ((pFVar41->arguments).count <= uVar37) {
                pcVar19 = 
                "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                ;
                goto LAB_00172770;
              }
              *(undefined8 **)((long)&((pFVar41->arguments).data)->source + lVar42) = puVar31;
              uVar44 = (ulong)pEVar20[uVar38].paramCount;
            }
            uVar37 = uVar37 + 1;
            lVar42 = lVar42 + 0x30;
          } while (uVar37 < uVar44);
          uVar16 = code->functionCount;
          uVar17 = code->moduleFunctionCount;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 < uVar16 - uVar17);
    }
  }
  NULLC::TraceScope::~TraceScope(&traceScope);
  return;
}

Assistant:

void ImportModuleFunctions(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleFunctions");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternVarInfo *explicitTypeInfo = FindFirstVar(bCode) + bCode->variableCount;

	moduleCtx.data->importedFunctionCount = bCode->moduleFunctionCount;

	// Import functions
	ExternFuncInfo *functionList = FindFirstFunc(bCode);
	ExternLocalInfo *localList = FindFirstLocal(bCode);

	unsigned currCount = ctx.functions.size();

	InplaceStr defaultAssignName = InplaceStr("default_assign$_");

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		InplaceStr functionName = InplaceStr(symbols + function.offsetToName);

		TypeBase *functionType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.funcType);

		if(!functionType)
			Stop(ctx, source, "ERROR: can't find function '%s' type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

		// Import function explicit type list
		IntrusiveList<MatchData> generics;

		bool hasGenericExplicitType = false;

		for(unsigned k = 0; k < function.explicitTypeCount; k++)
		{
			InplaceStr name = InplaceStr(symbols + explicitTypeInfo[k].offsetToName);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			TypeBase *type = explicitTypeInfo[k].type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, explicitTypeInfo[k].type);

			if(!type)
				Stop(ctx, source, "ERROR: can't find function '%s' explicit type '%d' in module %.*s", symbols + function.offsetToName, k, FMT_ISTR(moduleCtx.data->name));

			if(type->isGeneric)
				hasGenericExplicitType = true;

			generics.push_back(new (ctx.get<MatchData>()) MatchData(nameIdentifier, type));
		}

		explicitTypeInfo += function.explicitTypeCount;

		FunctionData *prev = NULL;
		FunctionData *prototype = NULL;

		for(FunctionLookupChain chain = LookupFunctionChainByName(ctx, function.nameHash); chain; chain = chain.next())
		{
			if(chain->isPrototype)
			{
				prototype = *chain;
				continue;
			}

			if(chain->type == functionType)
			{
				bool explicitTypeMatch = true;

				for(unsigned k = 0; k < function.explicitTypeCount; k++)
				{
					TypeBase *prevType = chain->generics[k]->type;
					TypeBase *type = generics[k]->type;

					if(&prevType != &type)
						explicitTypeMatch = false;
				}

				if(explicitTypeMatch)
				{
					prev = *chain;
					break;
				}
			}
		}

		if(prev)
		{
			if(*prev->name->name.begin == '$' || prev->isGenericInstance)
				ctx.functions.push_back(prev);
			else
				Stop(ctx, source, "ERROR: function %.*s (type %.*s) is already defined. While importing %.*s", FMT_ISTR(prev->name->name), FMT_ISTR(prev->type->name), FMT_ISTR(moduleCtx.data->name));

			continue;
		}

		NamespaceData *parentNamespace = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->fullNameHash == function.namespaceHash)
			{
				parentNamespace = ctx.namespaces[k];
				break;
			}
		}

		if(parentNamespace)
			ctx.PushScope(parentNamespace);

		TypeBase *parentType = NULL;

		if(function.parentType != ~0u)
		{
			parentType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.parentType);

			if(!parentType)
				Stop(ctx, source, "ERROR: can't find function '%s' parent type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		TypeBase *contextType = NULL;

		if(function.contextType != ~0u)
		{
			contextType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.contextType);

			if(!contextType)
				Stop(ctx, source, "ERROR: can't find function '%s' context type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}

		if(!contextType)
			contextType = ctx.GetReferenceType(parentType ? parentType : ctx.typeVoid);

		bool coroutine = function.funcCat == ExternFuncInfo::COROUTINE;
		bool accessor = *(functionName.end - 1) == '$';
		bool isOperator = function.isOperator != 0;

		if(parentType)
			ctx.PushScope(parentType);

		ModuleData *importModule = moduleCtx.data;

		if(function.definitionModule != 0)
			importModule = moduleCtx.dependencies[function.definitionModule - 1];

		assert(function.definitionLocationStart < importModule->lexStreamSize);
		assert(function.definitionLocationEnd < importModule->lexStreamSize);

		SynBase *locationSource = function.definitionLocationStart != 0 || function.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(function.definitionLocationStart + importModule->lexStream, function.definitionLocationEnd + importModule->lexStream) : source;

		assert(function.definitionLocationName < importModule->lexStreamSize);

		Lexeme *locationName = function.definitionLocationName + importModule->lexStream;

		SynIdentifier *identifier = function.definitionLocationName != 0 ? new (ctx.get<SynIdentifier>()) SynIdentifier(locationName, locationName, functionName) : new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *data = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, locationSource, ctx.scope, coroutine, accessor, isOperator, getType<TypeFunction>(functionType), contextType, identifier, generics, ctx.uniqueFunctionId++);

		data->importModule = importModule;

		data->isPrototype = (function.regVmCodeSize & 0x80000000) != 0;

		assert(data->isPrototype == ((function.regVmCodeSize & 0x80000000) != 0));

		if(prototype)
			prototype->implementation = data;

		// TODO: find function proto
		data->isGenericInstance = !!function.isGenericInstance;

		if(data->name->name == InplaceStr("__newS") || data->name->name == InplaceStr("__newA") || data->name->name == InplaceStr("__closeUpvalue"))
			data->isInternal = true;

		if(function.funcCat == ExternFuncInfo::LOCAL)
			data->isHidden = true;

		data->attributes = function.attributes;

		ctx.AddFunction(data);

		ctx.PushScope(data);

		data->functionScope = ctx.scope;

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			bool isExplicit = (argument.paramFlags & ExternLocalInfo::IS_EXPLICIT) != 0;

			TypeBase *argType = argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type);

			if(!argType)
				Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			InplaceStr argName = InplaceStr(symbols + argument.offsetToName);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(argName);

			data->arguments.push_back(ArgumentData(source, isExplicit, argNameIdentifier, argType, NULL));

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, argType);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, argType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);
		}

		assert(contextType);

		if(parentType)
		{
			TypeBase *type = ctx.GetReferenceType(parentType);

			unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, true);

			// Register type method
			if(TypeClass *typeClass = getType<TypeClass>(parentType))
			{
				if(const char *pos = strstr(data->name->name.begin, "::"))
				{
					typeClass->methods.push_back(data);
					typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), data);
				}
			}
		}
		else if(contextType)
		{
			unsigned offset = AllocateArgumentInScope(ctx, source, 0, contextType);

			SynIdentifier *argNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$context"));

			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, contextType, argNameIdentifier, offset, ctx.uniqueVariableId++);

			ctx.AddVariable(variable, false);
		}

		data->argumentsSize = data->functionScope->dataSize;

		// TODO: explicit flag
		if(function.funcType == 0 || functionType->isGeneric || hasGenericExplicitType || (parentType && parentType->isGeneric))
		{
			assert(function.genericOffsetStart < data->importModule->lexStreamSize);

			data->delayedDefinition = function.genericOffsetStart + data->importModule->lexStream;

			TypeBase *returnType = ctx.typeAuto;

			if(function.genericReturnType != ~0u)
				returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, function.genericReturnType);

			if(!returnType)
				Stop(ctx, source, "ERROR: can't find generic function '%s' return type in module %.*s", symbols + function.offsetToName, FMT_ISTR(moduleCtx.data->name));

			IntrusiveList<TypeHandle> argTypes;

			for(unsigned n = 0; n < function.paramCount; n++)
			{
				ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

				argTypes.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argument.type == ~0u ? ctx.typeGeneric : GetImportedModuleTypeAt(ctx, source, moduleCtx, argument.type)));
			}

			data->type = ctx.GetFunctionType(source, returnType, argTypes);
		}

		assert(data->type);

		ctx.PopScope(SCOPE_FUNCTION);

		if(data->isPrototype)
			ctx.HideFunction(data);
		else if(data->isHidden)
			ctx.HideFunction(data);

		if(parentType)
			ctx.PopScope(SCOPE_TYPE);

		if(parentNamespace)
			ctx.PopScope(SCOPE_NAMESPACE);

		if(functionName == defaultAssignName && data->arguments.size() == 2)
		{
			if(TypeClass *typeClass = getType<TypeClass>(data->arguments[1].type))
				typeClass->defaultAssign = data;
		}
	}

	for(unsigned i = 0; i < bCode->functionCount - bCode->moduleFunctionCount; i++)
	{
		ExternFuncInfo &function = functionList[i];

		FunctionData *data = ctx.functions[currCount + i];

		for(unsigned n = 0; n < function.paramCount; n++)
		{
			ExternLocalInfo &argument = localList[function.offsetToFirstLocal + n];

			if(argument.defaultFuncId != 0xffff)
			{
				FunctionData *target = ctx.functions[currCount + argument.defaultFuncId - bCode->moduleFunctionCount];

				ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, target->type, target, new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, target->contextType));

				data->arguments[n].value = new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, target->type->returnType, access, IntrusiveList<ExprBase>());
			}
		}
	}
}